

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall QPDF::parse(QPDF *this,char *password)

{
  long *plVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  bool bVar3;
  long lVar4;
  longlong xref_offset;
  QPDFExc *pQVar5;
  long offset;
  allocator<char> local_132 [2];
  string local_130;
  string local_110;
  undefined1 local_f0 [128];
  PatternFinder sf;
  PatternFinder hf;
  
  if (password != (char *)0x0) {
    std::__cxx11::string::assign
              ((char *)(*(long *)&(((this->m)._M_t.
                                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                    .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                  encp).
                                  super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>
                       + 0x50));
  }
  hf.super_Finder._vptr_Finder = (_func_int **)&PTR__Finder_002b0b28;
  hf.checker = (offset_in_QPDF_to_subr)findHeader;
  hf._24_8_ = 0;
  hf.qpdf = this;
  bVar3 = InputSource::findFirst
                    ((((this->m)._M_t.
                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"%PDF-",0,
                     0x400,&hf.super_Finder);
  if (!bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sf,"",(allocator<char> *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,"can\'t find PDF header",local_132);
    damagedPDF((QPDFExc *)local_f0,this,(string *)&sf,-1,&local_130);
    warn(this,(QPDFExc *)local_f0);
    QPDFExc::~QPDFExc((QPDFExc *)local_f0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&sf);
    std::__cxx11::string::assign
              ((char *)&((this->m)._M_t.
                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->pdf_version);
  }
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  (**(code **)(*plVar1 + 0x28))(plVar1,0,2);
  lVar4 = (**(code **)(**(long **)&(((this->m)._M_t.
                                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                     .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                   file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                      + 0x20))();
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->xref_table_max_offset = lVar4;
  if (lVar4 / 3 < (long)(_Var2._M_head_impl)->xref_table_max_id) {
    (_Var2._M_head_impl)->xref_table_max_id = (int)(lVar4 / 3);
  }
  offset = lVar4 + -0x41e;
  if (lVar4 < 0x41f) {
    offset = 0;
  }
  sf.super_Finder._vptr_Finder = (_func_int **)&PTR__Finder_002b0b28;
  sf.checker = (offset_in_QPDF_to_subr)findStartxref;
  sf._24_8_ = 0;
  sf.qpdf = this;
  bVar3 = InputSource::findLast
                    (((_Var2._M_head_impl)->file).
                     super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,"startxref",
                     offset,0,&sf.super_Finder);
  if (bVar3) {
    readToken((Token *)local_f0,this,
              (((this->m)._M_t.
                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
    xref_offset = QUtil::string_to_ll((char *)local_f0._8_8_);
    QPDFTokenizer::Token::~Token((Token *)local_f0);
    if (xref_offset != 0) {
      read_xref(this,xref_offset);
      initializeEncryption(this);
      _Var2._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      (_Var2._M_head_impl)->parsed = true;
      if (*(size_t *)((long)&(_Var2._M_head_impl)->xref_table + 0x28) != 0) {
        getRoot((QPDF *)&local_110);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"/Pages",local_132);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_130,&local_110);
        bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)&local_130);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length);
        std::__cxx11::string::~string((string *)local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_110._M_string_length);
        if (!bVar3) {
          pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f0,"",(allocator<char> *)&local_110);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,"unable to find page tree",local_132);
          damagedPDF(pQVar5,this,(string *)local_f0,-1,&local_130);
          __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
      }
      return;
    }
  }
  pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"",(allocator<char> *)&local_110);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"can\'t find startxref",local_132);
  damagedPDF(pQVar5,this,(string *)local_f0,-1,&local_130);
  __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDF::parse(char const* password)
{
    if (password) {
        m->encp->provided_password = password;
    }

    // Find the header anywhere in the first 1024 bytes of the file.
    PatternFinder hf(*this, &QPDF::findHeader);
    if (!m->file->findFirst("%PDF-", 0, 1024, hf)) {
        QTC::TC("qpdf", "QPDF not a pdf file");
        warn(damagedPDF("", -1, "can't find PDF header"));
        // QPDFWriter writes files that usually require at least version 1.2 for /FlateDecode
        m->pdf_version = "1.2";
    }

    // PDF spec says %%EOF must be found within the last 1024 bytes of/ the file.  We add an extra
    // 30 characters to leave room for the startxref stuff.
    m->file->seek(0, SEEK_END);
    qpdf_offset_t end_offset = m->file->tell();
    m->xref_table_max_offset = end_offset;
    // Sanity check on object ids. All objects must appear in xref table / stream. In all realistic
    // scenarios at least 3 bytes are required.
    if (m->xref_table_max_id > m->xref_table_max_offset / 3) {
        m->xref_table_max_id = static_cast<int>(m->xref_table_max_offset / 3);
    }
    qpdf_offset_t start_offset = (end_offset > 1054 ? end_offset - 1054 : 0);
    PatternFinder sf(*this, &QPDF::findStartxref);
    qpdf_offset_t xref_offset = 0;
    if (m->file->findLast("startxref", start_offset, 0, sf)) {
        xref_offset = QUtil::string_to_ll(readToken(*m->file).getValue().c_str());
    }

    try {
        if (xref_offset == 0) {
            QTC::TC("qpdf", "QPDF can't find startxref");
            throw damagedPDF("", -1, "can't find startxref");
        }
        try {
            read_xref(xref_offset);
        } catch (QPDFExc&) {
            throw;
        } catch (std::exception& e) {
            throw damagedPDF("", -1, std::string("error reading xref: ") + e.what());
        }
    } catch (QPDFExc& e) {
        if (m->attempt_recovery) {
            reconstruct_xref(e, xref_offset > 0);
            QTC::TC("qpdf", "QPDF reconstructed xref table");
        } else {
            throw;
        }
    }

    initializeEncryption();
    m->parsed = true;
    if (m->xref_table.size() > 0 && !getRoot().getKey("/Pages").isDictionary()) {
        // QPDFs created from JSON have an empty xref table and no root object yet.
        throw damagedPDF("", -1, "unable to find page tree");
    }
}